

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch2.hpp
# Opt level: O0

void __thiscall Catch::AssertionHandler::handleUnexpectedInflightException(AssertionHandler *this)

{
  IResultCapture *pIVar1;
  string local_30 [32];
  AssertionHandler *local_10;
  AssertionHandler *this_local;
  
  pIVar1 = this->m_resultCapture;
  local_10 = this;
  translateActiveException_abi_cxx11_();
  (*pIVar1->_vptr_IResultCapture[0xd])(pIVar1,this,local_30,&this->m_reaction);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void AssertionHandler::handleUnexpectedInflightException() {
        m_resultCapture.handleUnexpectedInflightException( m_assertionInfo, Catch::translateActiveException(), m_reaction );
    }